

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall Measurement_unaryOps_Test::TestBody(Measurement_unaryOps_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  measurement x;
  measurement y;
  unit local_50;
  unit local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  measurement local_30;
  measurement local_20;
  
  local_30.value_ = 2.0;
  local_30.units_ = (unit)&DAT_13c23d70a;
  local_20.value_ = 2.0;
  local_20.units_ = (unit)&DAT_13c23d70a;
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            (local_40,"y","x",&local_20,&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x37,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_48 != (unit)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_48.multiplier_ = 0.0;
  local_48.base_units_ = (unit_data)0xc0000000;
  local_50 = (unit)((ulong)local_30.value_ ^ 0x8000000000000000);
  testing::internal::CmpHelperEQ<double,double>
            (local_40,"z.value()","-x.value()",(double *)&local_48,(double *)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x38,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_48 != (unit)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_48 = (unit)&DAT_13c23d70a;
  local_50 = local_30.units_;
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            (local_40,"z.units()","x.units()",&local_48,&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x39,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if (local_48 != (unit)0x0) {
      (**(code **)(*(long *)local_48 + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  return;
}

Assistant:

TEST(Measurement, unaryOps)
{
    measurement x(2.0, cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}